

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O0

void __thiscall SparseArray<Value>::Set(SparseArray<Value> *this,uint32 index,Value *element)

{
  uint uVar1;
  SAChunk<Value> **ppSStack_30;
  uint32 indexInChunk;
  SAChunk<Value> **pPrev;
  SAChunk<Value> *chunk;
  Value *element_local;
  uint32 index_local;
  SparseArray<Value> *this_local;
  
  ppSStack_30 = &this->firstChunk;
  uVar1 = index % this->chunkSize;
  pPrev = &this->firstChunk->next;
  do {
    if (pPrev == (SAChunk<Value> **)0x0) {
LAB_005f8246:
      if (pPrev == (SAChunk<Value> **)0x0) {
        pPrev = (SAChunk<Value> **)
                Memory::ArenaAllocator::AllocZero(this->alloc,(ulong)this->chunkSize * 8 + 0x10);
        ((SAChunk<Value> *)pPrev)->startIndex = index - uVar1;
        UInt32Math::Add(((SAChunk<Value> *)pPrev)->startIndex,this->chunkSize);
        ((SAChunk<Value> *)pPrev)->next = *ppSStack_30;
        *ppSStack_30 = (SAChunk<Value> *)pPrev;
      }
      pPrev[(ulong)uVar1 + 2] = (SAChunk<Value> *)element;
      return;
    }
    if (index < *(uint *)(pPrev + 1)) {
      pPrev = (SAChunk<Value> **)0x0;
      goto LAB_005f8246;
    }
    if (index < *(int *)(pPrev + 1) + this->chunkSize) goto LAB_005f8246;
    ppSStack_30 = pPrev;
    pPrev = &(*pPrev)->next;
  } while( true );
}

Assistant:

void Set(uint32 index, T *element)
    {
        SAChunk<T> * chunk, **pPrev = &(this->firstChunk);
        uint32 indexInChunk = (index % this->chunkSize);

        for (chunk = this->firstChunk; chunk; chunk = chunk->next)
        {
            if (index < chunk->startIndex)
            {
                // Need a new chunk...
                chunk = NULL;
                break;
            }
            if (index < chunk->startIndex + this->chunkSize)
            {
                break;
            }
            pPrev = &(chunk->next);
        }

        if (chunk == NULL)
        {
            chunk = (SAChunk<T> *)this->alloc->AllocZero(sizeof(SAChunk<T>) + (chunkSize * sizeof(T *)));
            chunk->startIndex = index - indexInChunk;
            // Since startIndex and chunkSize don't change, check now if this overflows.
            // Cache the result or save memory ?
            UInt32Math::Add(chunk->startIndex, chunkSize);
            chunk->next = *pPrev;
            *pPrev = chunk;
        }
        chunk->data[indexInChunk] = element;
    }